

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O1

void pffft_real_preprocess(int Ncvec,v4sf *in,v4sf *out,v4sf *e)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  v4sf *pafVar20;
  long lVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  v4sf_union Xi;
  v4sf_union Xr;
  float local_28 [4];
  float local_18 [6];
  
  iVar19 = Ncvec + 3;
  if (-1 < Ncvec) {
    iVar19 = Ncvec;
  }
  if (in != out) {
    lVar21 = 0;
    do {
      *(float *)((long)local_18 + lVar21) = (*in)[lVar21 * 2];
      *(float *)((long)local_28 + lVar21) = in[1][lVar21 * 2];
      lVar21 = lVar21 + 4;
    } while (lVar21 != 0x10);
    fVar51 = (*in)[1] + in[6][1];
    fVar55 = (*in)[2] + in[6][2];
    fVar59 = (*in)[3] + in[6][3];
    fVar32 = (*in)[1] - in[6][1];
    fVar33 = (*in)[2] - in[6][2];
    fVar34 = (*in)[3] - in[6][3];
    fVar65 = in[2][1] + in[4][1];
    fVar69 = in[2][2] + in[4][2];
    fVar73 = in[2][3] + in[4][3];
    fVar35 = in[2][1] - in[4][1];
    fVar36 = in[2][2] - in[4][2];
    fVar38 = in[2][3] - in[4][3];
    fVar29 = in[1][1] + in[7][1];
    fVar30 = in[1][2] + in[7][2];
    fVar31 = in[1][3] + in[7][3];
    fVar40 = in[1][1] - in[7][1];
    fVar42 = in[1][2] - in[7][2];
    fVar44 = in[1][3] - in[7][3];
    fVar46 = in[3][1] + in[5][1];
    fVar47 = in[3][2] + in[5][2];
    fVar48 = in[3][3] + in[5][3];
    fVar23 = in[3][1] - in[5][1];
    fVar25 = in[3][2] - in[5][2];
    fVar27 = in[3][3] - in[5][3];
    fVar52 = fVar51 - fVar65;
    fVar56 = fVar55 - fVar69;
    fVar60 = fVar59 - fVar73;
    fVar66 = fVar32 - fVar46;
    fVar70 = fVar33 - fVar47;
    fVar74 = fVar34 - fVar48;
    fVar46 = fVar46 + fVar32;
    fVar47 = fVar47 + fVar33;
    fVar48 = fVar48 + fVar34;
    fVar24 = fVar23 + fVar40;
    fVar26 = fVar25 + fVar42;
    fVar28 = fVar27 + fVar44;
    fVar41 = fVar29 - fVar35;
    fVar43 = fVar30 - fVar36;
    fVar45 = fVar31 - fVar38;
    fVar29 = fVar29 + fVar35;
    fVar30 = fVar30 + fVar36;
    fVar31 = fVar31 + fVar38;
    fVar32 = (*e)[1];
    fVar33 = (*e)[2];
    fVar34 = (*e)[3];
    fVar35 = e[1][1];
    fVar36 = e[1][2];
    fVar38 = e[1][3];
    fVar37 = e[2][1];
    fVar39 = e[2][2];
    fVar9 = e[2][3];
    fVar10 = e[3][1];
    fVar11 = e[3][2];
    fVar12 = e[3][3];
    fVar13 = e[5][1];
    fVar14 = e[5][2];
    fVar15 = e[5][3];
    fVar16 = e[4][1];
    fVar17 = e[4][2];
    fVar18 = e[4][3];
    out[1][0] = fVar65 + fVar51;
    out[1][1] = fVar35 * fVar41 + fVar66 * fVar32;
    out[1][2] = fVar10 * fVar24 + fVar52 * fVar37;
    out[1][3] = fVar13 * fVar29 + fVar46 * fVar16;
    out[2][0] = fVar40 - fVar23;
    out[2][1] = fVar41 * fVar32 - fVar66 * fVar35;
    out[2][2] = fVar24 * fVar37 - fVar52 * fVar10;
    out[2][3] = fVar29 * fVar16 - fVar46 * fVar13;
    out[3][0] = fVar69 + fVar55;
    out[3][1] = fVar36 * fVar43 + fVar70 * fVar33;
    out[3][2] = fVar11 * fVar26 + fVar56 * fVar39;
    out[3][3] = fVar14 * fVar30 + fVar47 * fVar17;
    out[4][0] = fVar42 - fVar25;
    out[4][1] = fVar43 * fVar33 - fVar70 * fVar36;
    out[4][2] = fVar26 * fVar39 - fVar56 * fVar11;
    out[4][3] = fVar30 * fVar17 - fVar47 * fVar14;
    out[5][0] = fVar73 + fVar59;
    out[5][1] = fVar38 * fVar45 + fVar74 * fVar34;
    out[5][2] = fVar12 * fVar28 + fVar60 * fVar9;
    out[5][3] = fVar15 * fVar31 + fVar48 * fVar18;
    out[6][0] = fVar44 - fVar27;
    out[6][1] = fVar45 * fVar34 - fVar74 * fVar38;
    out[6][2] = fVar28 * fVar9 - fVar60 * fVar12;
    out[6][3] = fVar31 * fVar18 - fVar48 * fVar15;
    if (7 < Ncvec) {
      uVar22 = 2;
      if (2 < iVar19 >> 2) {
        uVar22 = (ulong)(uint)(iVar19 >> 2);
      }
      pafVar20 = e + 0xb;
      lVar21 = 0;
      do {
        pfVar1 = (float *)((long)in[8] + lVar21);
        pfVar2 = (float *)((long)in[9] + lVar21);
        pfVar3 = (float *)((long)in[10] + lVar21);
        pfVar4 = (float *)((long)in[0xb] + lVar21);
        pfVar5 = (float *)((long)in[0xc] + lVar21);
        pfVar6 = (float *)((long)in[0xd] + lVar21);
        pfVar7 = (float *)((long)in[0xe] + lVar21);
        pfVar8 = (float *)((long)in[0xf] + lVar21);
        fVar49 = *pfVar1 + *pfVar7;
        fVar53 = pfVar1[1] + pfVar7[1];
        fVar57 = pfVar1[2] + pfVar7[2];
        fVar61 = pfVar1[3] + pfVar7[3];
        fVar32 = *pfVar1 - *pfVar7;
        fVar33 = pfVar1[1] - pfVar7[1];
        fVar34 = pfVar1[2] - pfVar7[2];
        fVar35 = pfVar1[3] - pfVar7[3];
        fVar63 = *pfVar3 + *pfVar5;
        fVar67 = pfVar3[1] + pfVar5[1];
        fVar71 = pfVar3[2] + pfVar5[2];
        fVar75 = pfVar3[3] + pfVar5[3];
        fVar36 = *pfVar3 - *pfVar5;
        fVar38 = pfVar3[1] - pfVar5[1];
        fVar37 = pfVar3[2] - pfVar5[2];
        fVar39 = pfVar3[3] - pfVar5[3];
        fVar45 = *pfVar2 + *pfVar8;
        fVar46 = pfVar2[1] + pfVar8[1];
        fVar47 = pfVar2[2] + pfVar8[2];
        fVar48 = pfVar2[3] + pfVar8[3];
        fVar51 = *pfVar2 - *pfVar8;
        fVar55 = pfVar2[1] - pfVar8[1];
        fVar59 = pfVar2[2] - pfVar8[2];
        fVar65 = pfVar2[3] - pfVar8[3];
        fVar69 = *pfVar4 + *pfVar6;
        fVar70 = pfVar4[1] + pfVar6[1];
        fVar73 = pfVar4[2] + pfVar6[2];
        fVar74 = pfVar4[3] + pfVar6[3];
        fVar29 = *pfVar4 - *pfVar6;
        fVar31 = pfVar4[1] - pfVar6[1];
        fVar41 = pfVar4[2] - pfVar6[2];
        fVar43 = pfVar4[3] - pfVar6[3];
        fVar50 = fVar49 - fVar63;
        fVar54 = fVar53 - fVar67;
        fVar58 = fVar57 - fVar71;
        fVar62 = fVar61 - fVar75;
        fVar64 = fVar32 - fVar69;
        fVar68 = fVar33 - fVar70;
        fVar72 = fVar34 - fVar73;
        fVar76 = fVar35 - fVar74;
        fVar69 = fVar69 + fVar32;
        fVar70 = fVar70 + fVar33;
        fVar73 = fVar73 + fVar34;
        fVar74 = fVar74 + fVar35;
        fVar30 = fVar29 + fVar51;
        fVar40 = fVar31 + fVar55;
        fVar42 = fVar41 + fVar59;
        fVar44 = fVar43 + fVar65;
        fVar52 = fVar45 - fVar36;
        fVar56 = fVar46 - fVar38;
        fVar60 = fVar47 - fVar37;
        fVar66 = fVar48 - fVar39;
        fVar45 = fVar45 + fVar36;
        fVar46 = fVar46 + fVar38;
        fVar47 = fVar47 + fVar37;
        fVar48 = fVar48 + fVar39;
        fVar32 = pafVar20[-5][0];
        fVar33 = pafVar20[-5][1];
        fVar34 = pafVar20[-5][2];
        fVar35 = pafVar20[-5][3];
        fVar36 = pafVar20[-4][0];
        fVar38 = pafVar20[-4][1];
        fVar37 = pafVar20[-4][2];
        fVar39 = pafVar20[-4][3];
        fVar9 = pafVar20[-3][0];
        fVar10 = pafVar20[-3][1];
        fVar11 = pafVar20[-3][2];
        fVar12 = pafVar20[-3][3];
        fVar13 = pafVar20[-2][0];
        fVar14 = pafVar20[-2][1];
        fVar15 = pafVar20[-2][2];
        fVar16 = pafVar20[-2][3];
        fVar17 = (*pafVar20)[0];
        fVar18 = (*pafVar20)[1];
        fVar23 = (*pafVar20)[2];
        fVar24 = (*pafVar20)[3];
        fVar25 = pafVar20[-1][0];
        fVar26 = pafVar20[-1][1];
        fVar27 = pafVar20[-1][2];
        fVar28 = pafVar20[-1][3];
        pfVar1 = (float *)((long)out[7] + lVar21);
        *pfVar1 = fVar63 + fVar49;
        pfVar1[1] = fVar36 * fVar52 + fVar64 * fVar32;
        pfVar1[2] = fVar13 * fVar30 + fVar50 * fVar9;
        pfVar1[3] = fVar17 * fVar45 + fVar69 * fVar25;
        pfVar1 = (float *)((long)out[8] + lVar21);
        *pfVar1 = fVar51 - fVar29;
        pfVar1[1] = fVar52 * fVar32 - fVar64 * fVar36;
        pfVar1[2] = fVar30 * fVar9 - fVar50 * fVar13;
        pfVar1[3] = fVar45 * fVar25 - fVar69 * fVar17;
        pfVar1 = (float *)((long)out[9] + lVar21);
        *pfVar1 = fVar67 + fVar53;
        pfVar1[1] = fVar38 * fVar56 + fVar68 * fVar33;
        pfVar1[2] = fVar14 * fVar40 + fVar54 * fVar10;
        pfVar1[3] = fVar18 * fVar46 + fVar70 * fVar26;
        pfVar1 = (float *)((long)out[10] + lVar21);
        *pfVar1 = fVar55 - fVar31;
        pfVar1[1] = fVar56 * fVar33 - fVar68 * fVar38;
        pfVar1[2] = fVar40 * fVar10 - fVar54 * fVar14;
        pfVar1[3] = fVar46 * fVar26 - fVar70 * fVar18;
        pfVar1 = (float *)((long)out[0xb] + lVar21);
        *pfVar1 = fVar71 + fVar57;
        pfVar1[1] = fVar37 * fVar60 + fVar72 * fVar34;
        pfVar1[2] = fVar15 * fVar42 + fVar58 * fVar11;
        pfVar1[3] = fVar23 * fVar47 + fVar73 * fVar27;
        pfVar1 = (float *)((long)out[0xc] + lVar21);
        *pfVar1 = fVar59 - fVar41;
        pfVar1[1] = fVar60 * fVar34 - fVar72 * fVar37;
        pfVar1[2] = fVar42 * fVar11 - fVar58 * fVar15;
        pfVar1[3] = fVar47 * fVar27 - fVar73 * fVar23;
        pfVar1 = (float *)((long)out[0xd] + lVar21);
        *pfVar1 = fVar75 + fVar61;
        pfVar1[1] = fVar39 * fVar66 + fVar76 * fVar35;
        pfVar1[2] = fVar16 * fVar44 + fVar62 * fVar12;
        pfVar1[3] = fVar24 * fVar48 + fVar74 * fVar28;
        pfVar1 = (float *)((long)out[0xe] + lVar21);
        *pfVar1 = fVar65 - fVar43;
        pfVar1[1] = fVar66 * fVar35 - fVar76 * fVar39;
        pfVar1[2] = fVar44 * fVar12 - fVar62 * fVar16;
        pfVar1[3] = fVar48 * fVar28 - fVar74 * fVar24;
        pafVar20 = pafVar20 + 6;
        lVar21 = lVar21 + 0x80;
      } while (uVar22 * 0x80 + -0x80 != lVar21);
    }
    (*out)[0] = local_18[2] + local_18[2] + local_18[0] + local_28[0];
    (*out)[1] = (local_18[0] - local_28[0]) - (local_28[2] + local_28[2]);
    (*out)[2] = (local_18[0] + local_28[0]) - (local_18[2] + local_18[2]);
    (*out)[3] = local_28[2] + local_28[2] + (local_18[0] - local_28[0]);
    lVar21 = (long)(Ncvec * 2);
    out[lVar21 + -1][0] = local_18[1] + local_18[3] + local_18[1] + local_18[3];
    fVar32 = (local_28[1] + local_28[3]) * -1.4142135;
    out[lVar21 + -1][1] = (local_18[1] - local_18[3]) * 1.4142135 + fVar32;
    out[lVar21 + -1][2] = (local_28[3] - local_28[1]) + (local_28[3] - local_28[1]);
    out[lVar21 + -1][3] = (local_18[1] - local_18[3]) * -1.4142135 + fVar32;
    return;
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x626,"void pffft_real_preprocess(int, const v4sf *, v4sf *, const v4sf *)");
}

Assistant:

static NEVER_INLINE(void) pffft_real_preprocess(int Ncvec, const v4sf *in, v4sf *out, const v4sf *e) {
  int k, dk = Ncvec/SIMD_SZ; // number of 4x4 matrix blocks
  /* fftpack order is f0r f1r f1i f2r f2i ... f(n-1)r f(n-1)i f(n)r */

  v4sf_union Xr, Xi, *uout = (v4sf_union*)out;
  float cr0, ci0, cr1, ci1, cr2, ci2, cr3, ci3;
  static const float s = M_SQRT2;
  assert(in != out);
  for (k=0; k < 4; ++k) {
    Xr.f[k] = ((float*)in)[8*k];
    Xi.f[k] = ((float*)in)[8*k+4];
  }

  pffft_real_preprocess_4x4(in, e, out+1, 1); // will write only 6 values

  /*
    [Xr0 Xr1 Xr2 Xr3 Xi0 Xi1 Xi2 Xi3]

    [cr0] [1   0   2   0   1   0   0   0]
    [cr1] [1   0   0   0  -1   0  -2   0]
    [cr2] [1   0  -2   0   1   0   0   0]
    [cr3] [1   0   0   0  -1   0   2   0]
    [ci0] [0   2   0   2   0   0   0   0]
    [ci1] [0   s   0  -s   0  -s   0  -s]
    [ci2] [0   0   0   0   0  -2   0   2]
    [ci3] [0  -s   0   s   0  -s   0  -s]
  */
  for (k=1; k < dk; ++k) {    
    pffft_real_preprocess_4x4(in+8*k, e + k*6, out-1+k*8, 0);
  }

  cr0=(Xr.f[0]+Xi.f[0]) + 2*Xr.f[2]; uout[0].f[0] = cr0;
  cr1=(Xr.f[0]-Xi.f[0]) - 2*Xi.f[2]; uout[0].f[1] = cr1;
  cr2=(Xr.f[0]+Xi.f[0]) - 2*Xr.f[2]; uout[0].f[2] = cr2;
  cr3=(Xr.f[0]-Xi.f[0]) + 2*Xi.f[2]; uout[0].f[3] = cr3;
  ci0= 2*(Xr.f[1]+Xr.f[3]);                       uout[2*Ncvec-1].f[0] = ci0;
  ci1= s*(Xr.f[1]-Xr.f[3]) - s*(Xi.f[1]+Xi.f[3]); uout[2*Ncvec-1].f[1] = ci1;
  ci2= 2*(Xi.f[3]-Xi.f[1]);                       uout[2*Ncvec-1].f[2] = ci2;
  ci3=-s*(Xr.f[1]-Xr.f[3]) - s*(Xi.f[1]+Xi.f[3]); uout[2*Ncvec-1].f[3] = ci3;
}